

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O2

VRDatumPtr __thiscall MinVR::CreateVRDatumString(MinVR *this,void *pData)

{
  VRDatum_conflict *pValue;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar1;
  VRString VStack_38;
  
  pValue = (VRDatum_conflict *)operator_new(0x68);
  std::__cxx11::string::string((string *)&VStack_38,(string *)pData);
  VRDatumString::VRDatumString((VRDatumString *)pValue,&VStack_38);
  std::__cxx11::string::~string((string *)&VStack_38);
  VRDatumPtr::VRDatumPtr((VRDatumPtr *)this,pValue);
  VVar1.reference = extraout_RDX;
  VVar1.pData = (VRDatum_conflict *)this;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumString(void *pData) {
  VRDatumString *obj = new VRDatumString(*static_cast<VRString *>(pData));
  return VRDatumPtr(obj);
}